

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall
CppGenerator::registerAggregatesToVariables
          (CppGenerator *this,Aggregate *aggregate,size_t group_id,size_t view_id,size_t agg_id,
          size_t depth,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *localAggReg)

{
  pointer ppVar1;
  _WordT *p_Var2;
  uint uVar3;
  uint uVar4;
  size_t *psVar5;
  long lVar6;
  pointer ppVar7;
  pointer pvVar8;
  pointer pPVar9;
  undefined8 uVar10;
  pointer pvVar11;
  pointer pPVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  bool bVar15;
  View *pVVar16;
  TDNode *pTVar17;
  size_t sVar18;
  View *pVVar19;
  Function *__x;
  bitset<1500UL> *__src;
  Function *__x_00;
  ostream *poVar20;
  iterator iVar21;
  mapped_type *pmVar22;
  unsigned_long uVar23;
  iterator iVar24;
  mapped_type *pmVar25;
  unsigned_long *puVar26;
  byte bVar27;
  ulong uVar28;
  long lVar29;
  mapped_type mVar30;
  bitset<100UL> *this_00;
  pointer pDVar31;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar32;
  ulong uVar33;
  _Base_bitset<24UL> *p_Var34;
  size_type sVar35;
  mapped_type mVar36;
  size_t *incViewID;
  bitset<100UL> *__y;
  size_t *psVar37;
  size_t var;
  ulong uVar38;
  long lVar39;
  size_t sVar40;
  long lVar41;
  bitset<100UL> bVar42;
  size_type local_610;
  long local_5f0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  viewReg;
  var_bitset dependentVariables;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  localComputation;
  var_bitset nonVarOrder;
  var_bitset overlapVars;
  var_bitset dependentFunctionVars;
  _Base_bitset<2UL> local_518;
  ProductAggregate prodAgg;
  prod_bitset overlapFunc;
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_348;
  unsigned_long uStack_330;
  unsigned_long local_328;
  undefined1 uStack_320;
  undefined7 uStack_31f;
  undefined1 uStack_318;
  undefined8 uStack_317;
  bool local_2d8;
  ProductAggregate local_2d0;
  dyn_bitset loopFactors;
  prod_bitset considered;
  prod_bitset localFunctions;
  
  pVVar16 = QueryCompiler::getView
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,view_id);
  pTVar17 = TreeDecomposition::getRelation
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(ulong)pVVar16->_origin);
  pvVar32 = this->groupVariableOrder;
  this_00 = (this->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start + group_id;
  local_610 = ((long)(aggregate->_agg).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(aggregate->_agg).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc0;
  uVar4 = pVVar16->_origin;
  uVar3 = pVVar16->_destination;
  sVar40 = pTVar17->_numOfNeighbors;
  sVar18 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&loopFactors,sVar18 + 1,0,(allocator<unsigned_long> *)&overlapFunc);
  overlapFunc.super__Base_bitset<24UL>._M_w[1] = 0;
  overlapFunc.super__Base_bitset<24UL>._M_w[0] =
       (long)pvVar32[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)pvVar32[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&localComputation,local_610,(value_type *)&overlapFunc,(allocator_type *)&prodAgg);
  __y = &pTVar17->_bag;
  pvVar32 = pvVar32 + group_id;
  lVar41 = sVar40 - (uVar4 != uVar3);
  viewReg.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  viewReg.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  viewReg.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&localFunctions,0,0xc0);
  memset(&considered,0,0xc0);
  dependentVariables.super__Base_bitset<2UL>._M_w[0] = 0;
  dependentVariables.super__Base_bitset<2UL>._M_w[1] = 0;
  overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ = std::bitset<100UL>::operator~(this_00);
  nonVarOrder.super__Base_bitset<2UL>._M_w =
       (_Base_bitset<2UL>)std::operator&(&pVVar16->_fVars,(bitset<100UL> *)&overlapFunc);
  for (uVar38 = 0; uVar38 != 100; uVar38 = uVar38 + 1) {
    uVar28 = uVar38 >> 6;
    uVar33 = 1L << ((byte)uVar38 & 0x3f);
    if ((nonVarOrder.super__Base_bitset<2UL>._M_w[uVar28] >> (uVar38 & 0x3f) & 1) != 0) {
      if (((__y->super__Base_bitset<2UL>)._M_w[uVar28] & uVar33) == 0) {
        psVar5 = this->incomingViews[view_id].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (psVar37 = this->incomingViews[view_id].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; psVar37 != psVar5; psVar37 = psVar37 + 1) {
          pVVar19 = QueryCompiler::getView
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               *psVar37);
          if (((pVVar19->_fVars).super__Base_bitset<2UL>._M_w[uVar28] & uVar33) != 0) {
            prodAgg.product.super__Base_bitset<24UL>._M_w._0_16_ =
                 std::bitset<100UL>::operator~(this_00);
            overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ =
                 std::operator&(&pVVar19->_fVars,(bitset<100UL> *)&prodAgg);
            std::_Base_bitset<2UL>::_M_do_or
                      (&dependentVariables.super__Base_bitset<2UL>,(_Base_bitset<2UL> *)&overlapFunc
                      );
          }
        }
      }
      else {
        prodAgg.product.super__Base_bitset<24UL>._M_w._0_16_ =
             std::bitset<100UL>::operator~(this_00);
        overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ =
             std::operator&(__y,(bitset<100UL> *)&prodAgg);
        std::_Base_bitset<2UL>::_M_do_or
                  (&dependentVariables.super__Base_bitset<2UL>,(_Base_bitset<2UL> *)&overlapFunc);
      }
    }
  }
  sVar40 = depth + 1;
  local_5f0 = 0;
  sVar35 = 0;
  do {
    if (sVar35 == local_610) {
      uVar23 = (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if (uVar23 - 1 == depth) {
        puVar26 = &((localAggReg->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->second;
        sVar35 = local_610;
        while (bVar15 = sVar35 != 0, sVar35 = sVar35 - 1, bVar15) {
          ((pair<unsigned_long,_unsigned_long> *)(puVar26 + -1))->first = uVar23;
          *puVar26 = 0;
          puVar26 = puVar26 + 2;
        }
      }
      else {
        registerAggregatesToVariables(this,aggregate,group_id,view_id,agg_id,sVar40,localAggReg);
      }
      uVar38 = this->viewLevelRegister[view_id];
      if ((uVar38 < depth) ||
         (uVar38 == (long)(pvVar32->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(pvVar32->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start >> 3)) {
        lVar41 = 0;
        for (sVar35 = 0; local_610 != sVar35; sVar35 = sVar35 + 1) {
          uVar38 = (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3;
          ppVar7 = (localAggReg->
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((*(ulong *)((long)&(localComputation.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->first + lVar41) <
               uVar38) || (*(ulong *)((long)&ppVar7->first + lVar41) < uVar38)) {
            overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ =
                 *(undefined1 (*) [16])
                  ((long)&(localComputation.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar41);
            p_Var2 = (_WordT *)((long)&ppVar7->first + lVar41);
            overlapFunc.super__Base_bitset<24UL>._M_w[2] = *p_Var2;
            overlapFunc.super__Base_bitset<24UL>._M_w[3] = p_Var2[1];
            iVar24 = std::
                     _Hashtable<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->postRegisterMap).
                             super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[depth]._M_h,
                            (key_type *)&overlapFunc);
            if (iVar24.
                super__Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true>.
                _M_cur == (__node_type *)0x0) {
              pvVar11 = (this->postRegisterList).
                        super__Vector_base<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar29 = *(long *)&pvVar11[depth].
                                 super__Vector_base<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>
                                 ._M_impl.super__Vector_impl_data;
              pPVar12 = *(pointer *)
                         ((long)&pvVar11[depth].
                                 super__Vector_base<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>
                                 ._M_impl.super__Vector_impl_data + 8);
              pmVar25 = std::__detail::
                        _Map_base<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)((this->postRegisterMap).
                                         super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + depth),
                                     (key_type *)&overlapFunc);
              mVar36 = (long)pPVar12 - lVar29 >> 5;
              *pmVar25 = mVar36;
              ppVar7 = (localAggReg->
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              *(size_t *)((long)&ppVar7->first + lVar41) = depth;
              *(mapped_type *)((long)&ppVar7->second + lVar41) = mVar36;
              std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>::push_back
                        ((this->postRegisterList).
                         super__Vector_base<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + depth,(key_type *)&overlapFunc)
              ;
            }
            else {
              uVar10 = *(undefined8 *)
                        ((long)iVar24.
                               super__Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true>
                               ._M_cur + 0x28);
              ppVar7 = (localAggReg->
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              *(size_t *)((long)&ppVar7->first + lVar41) = depth;
              *(undefined8 *)((long)&ppVar7->second + lVar41) = uVar10;
            }
          }
          else if (sVar40 != uVar38) {
            std::operator<<((ostream *)&std::cerr,"ERROR ERROR ERROR - postAggregate is empty ");
            std::operator<<((ostream *)&std::cerr,"we would expect it to contain something || ");
            poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            poVar20 = std::operator<<(poVar20," : ");
            poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
            poVar20 = std::operator<<(poVar20,"  ");
            poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
            std::operator<<(poVar20,"\n");
LAB_001b3019:
            exit(1);
          }
          lVar41 = lVar41 + 0x10;
        }
        uVar38 = this->viewLevelRegister[view_id];
      }
      if ((uVar38 == depth) ||
         ((depth == 0 &&
          (uVar38 == (long)(pvVar32->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar32->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3)))) {
        lVar29 = 0;
        lVar41 = 0;
        while( true ) {
          bVar15 = local_610 == 0;
          local_610 = local_610 - 1;
          if (bVar15) break;
          pDVar31 = (this->dependentComputation).
                    super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          p_Var34 = (_Base_bitset<24UL> *)
                    ((long)(pDVar31->product).super__Base_bitset<24UL>._M_w + lVar41);
          memset(&prodAgg,0,0xf9);
          memcpy(&prodAgg,p_Var34,0xc0);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::operator=(&prodAgg.viewAggregate,
                      (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)((long)&(pDVar31->view).
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl + lVar41));
          sVar40 = (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3;
          prodAgg.previous.second = 0;
          overlapFunc.super__Base_bitset<24UL>._M_w[7] = 0;
          overlapFunc.super__Base_bitset<24UL>._M_w[8]._0_1_ = 0;
          overlapFunc.super__Base_bitset<24UL>._M_w[9] = 0;
          prodAgg.previous.first = sVar40;
          memset(&local_2d0,0,0xf9);
          overlapFunc.super__Base_bitset<24UL>._M_w[2] = 0;
          overlapFunc.super__Base_bitset<24UL>._M_w[3] = 0;
          overlapFunc.super__Base_bitset<24UL>._M_w[4] = 0;
          overlapFunc.super__Base_bitset<24UL>._M_w[5] = 0;
          overlapFunc.super__Base_bitset<24UL>._M_w[6]._0_1_ = 0;
          memset(overlapFunc.super__Base_bitset<24UL>._M_w + 0xb,0,0xd9);
          overlapFunc.super__Base_bitset<24UL>._M_w[1] = agg_id;
          overlapFunc.super__Base_bitset<24UL>._M_w[0] = view_id;
          if (this->viewLevelRegister[view_id] == sVar40) {
            overlapFunc.super__Base_bitset<24UL>._M_w[3] = 0;
            overlapFunc.super__Base_bitset<24UL>._M_w[2] = sVar40;
          }
          else {
            overlapFunc.super__Base_bitset<24UL>._M_w[2] =
                 *(_WordT *)
                  ((long)&(localComputation.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar29);
            overlapFunc.super__Base_bitset<24UL>._M_w[3] =
                 *(_WordT *)
                  ((long)&(localComputation.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->second + lVar29);
          }
          p_Var2 = (_WordT *)
                   ((long)&((localAggReg->
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->first + lVar29);
          overlapFunc.super__Base_bitset<24UL>._M_w[4] = *p_Var2;
          overlapFunc.super__Base_bitset<24UL>._M_w[5] = p_Var2[1];
          DependentComputation::operator=
                    ((DependentComputation *)(overlapFunc.super__Base_bitset<24UL>._M_w + 0xb),
                     (DependentComputation *)
                     ((long)(((this->dependentComputation).
                              super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>
                              ._M_impl.super__Vector_impl_data._M_start)->product).
                            super__Base_bitset<24UL>._M_w + lVar41));
          ProductAggregate::operator=(&local_2d0,&prodAgg);
          bVar15 = std::_Base_bitset<24UL>::_M_is_any(p_Var34);
          if ((bVar15) ||
             (*(long *)((long)&(pDVar31->view).
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl + lVar41) !=
              *(long *)((long)&(pDVar31->view).
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl + lVar41 + 8))) {
            local_2d8 = true;
          }
          std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::push_back
                    ((this->aggregateComputation).
                     super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + view_id,(value_type *)&overlapFunc)
          ;
          AggregateTuple::~AggregateTuple((value_type *)&overlapFunc);
          std::
          _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::~_Vector_base(&prodAgg.viewAggregate.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         );
          lVar41 = lVar41 + 0xd8;
          lVar29 = lVar29 + 0x10;
        }
      }
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&viewReg.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&localComputation.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&loopFactors);
      return;
    }
    p_Var34 = &(aggregate->_agg).
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar35].super__Base_bitset<24UL>;
    memset(&considered,0,0xc0);
    memset(&localFunctions,0,0xc0);
    for (sVar18 = 0; sVar18 != 0x5dc; sVar18 = sVar18 + 1) {
      bVar15 = std::bitset<1500UL>::test((bitset<1500UL> *)p_Var34,sVar18);
      if ((bVar15) &&
         ((considered.super__Base_bitset<24UL>._M_w[sVar18 >> 6] >> (sVar18 & 0x3f) & 1) == 0)) {
        __x = QueryCompiler::getFunction
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,sVar18);
        std::bitset<1500UL>::set(&considered,sVar18,true);
        bVar42 = std::operator&(&__x->_fVars,
                                (this->coveredVariables).
                                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + depth);
        if ((bVar42.super__Base_bitset<2UL>._M_w[0] == (__x->_fVars).super__Base_bitset<2UL>._M_w[0]
            ) && (bVar42.super__Base_bitset<2UL>._M_w[1] ==
                  (__x->_fVars).super__Base_bitset<2UL>._M_w[1])) {
          dependentFunctionVars.super__Base_bitset<2UL>._M_w[0] = 0;
          dependentFunctionVars.super__Base_bitset<2UL>._M_w[1] = 0;
          lVar29 = 0;
          for (uVar38 = 0; uVar38 != 100; uVar38 = uVar38 + 1) {
            if (((__x->_fVars).super__Base_bitset<2UL>._M_w[uVar38 >> 6] >> (uVar38 & 0x3f) & 1) !=
                0) {
              std::_Base_bitset<2UL>::_M_do_or
                        (&dependentFunctionVars.super__Base_bitset<2UL>,
                         (_Base_bitset<2UL> *)
                         ((long)(((this->variableDependency).
                                  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Base_bitset<2UL>)._M_w + lVar29));
            }
            lVar29 = lVar29 + 0x10;
          }
          overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ = std::bitset<100UL>::operator~(this_00);
          std::_Base_bitset<2UL>::_M_do_and
                    (&dependentFunctionVars.super__Base_bitset<2UL>,
                     (_Base_bitset<2UL> *)&overlapFunc);
          overlapVars.super__Base_bitset<2UL>._M_w[0] = 0;
          overlapVars.super__Base_bitset<2UL>._M_w[1] = 0;
          memset(&prodAgg,0,0xc0);
          __src = std::bitset<1500UL>::set(&prodAgg.product,sVar18,true);
          memcpy(&overlapFunc,__src,0xc0);
          do {
            std::_Base_bitset<2UL>::_M_do_or
                      (&overlapVars.super__Base_bitset<2UL>,(_Base_bitset<2UL> *)__x);
            bVar15 = true;
            bVar27 = 0;
            for (uVar38 = 0; uVar38 != 0x5dc; uVar38 = uVar38 + 1) {
              uVar28 = uVar38 >> 6;
              uVar33 = 1L << ((byte)uVar38 & 0x3f);
              if ((((p_Var34->_M_w[uVar28] >> (uVar38 & 0x3f) & 1) != 0) &&
                  ((considered.super__Base_bitset<24UL>._M_w[uVar28] & uVar33) == 0)) &&
                 ((overlapFunc.super__Base_bitset<24UL>._M_w[uVar28] & uVar33) == 0)) {
                __x_00 = QueryCompiler::getFunction
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,sVar18);
                bVar42 = std::operator&(&__x_00->_fVars,&dependentFunctionVars);
                if (bVar42.super__Base_bitset<2UL>._M_w[1] != 0 ||
                    bVar42.super__Base_bitset<2UL>._M_w[0] != 0) {
                  std::bitset<1500UL>::set(&considered,uVar38,true);
                  std::bitset<1500UL>::set(&overlapFunc,uVar38,true);
                  std::_Base_bitset<2UL>::_M_do_or
                            (&overlapVars.super__Base_bitset<2UL>,(_Base_bitset<2UL> *)__x_00);
                  bVar42 = std::operator&(&__x_00->_fVars,
                                          (this->coveredVariables).
                                          super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + depth);
                  bVar15 = (bool)(bVar15 & bVar42.super__Base_bitset<2UL>._M_w ==
                                           (_Base_bitset<2UL>)
                                           *&(__x_00->_fVars).super__Base_bitset<2UL>._M_w);
                  bVar27 = 1;
                }
              }
            }
          } while (!(bool)(~bVar27 & 1) && !bVar15);
          if (bVar15) {
            local_518._M_w = (_WordT  [2])std::bitset<100UL>::operator~(this_00);
            prodAgg.product.super__Base_bitset<24UL>._M_w._0_16_ =
                 std::operator&(&overlapVars,(bitset<100UL> *)&local_518);
            bVar42 = std::operator&((bitset<100UL> *)&prodAgg,&dependentVariables);
            pDVar31 = (pointer)&localFunctions;
            if (bVar42.super__Base_bitset<2UL>._M_w[1] != 0 ||
                bVar42.super__Base_bitset<2UL>._M_w[0] != 0) {
              if (this->viewLevelRegister[view_id] != depth) {
                poVar20 = std::operator<<((ostream *)&std::cerr,
                                          "ERROR ERROR: in dependent computation:");
                std::operator<<(poVar20," viewLevelRegister[viewID] != depth\n");
              }
              pDVar31 = (this->dependentComputation).
                        super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>
                        ._M_impl.super__Vector_impl_data._M_start + sVar35;
            }
            std::_Base_bitset<24UL>::_M_do_or
                      ((_Base_bitset<24UL> *)pDVar31,&overlapFunc.super__Base_bitset<24UL>);
            std::bitset<1500UL>::operator~
                      (&prodAgg.product,(bitset<1500UL> *)&overlapFunc.super__Base_bitset<24UL>);
            std::_Base_bitset<24UL>::_M_do_and(p_Var34,(_Base_bitset<24UL> *)&prodAgg);
          }
        }
      }
    }
    lVar29 = local_5f0;
    lVar39 = lVar41;
    if (viewReg.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        viewReg.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      viewReg.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           viewReg.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    while (bVar15 = lVar39 != 0, lVar39 = lVar39 + -1, bVar15) {
      ppVar7 = (aggregate->_incoming).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = *(long *)((long)&ppVar7->first + lVar29);
      sVar18 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      uVar38 = (sVar18 + 1) * depth + lVar6;
      if (((this->addableViews).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38 >> 6] >> (uVar38 & 0x3f) & 1) != 0) {
        pVVar19 = QueryCompiler::getView
                            ((this->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             *(size_t *)((long)&ppVar7->first + lVar29));
        prodAgg.product.super__Base_bitset<24UL>._M_w._0_16_ =
             std::bitset<100UL>::operator~(this_00);
        overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ =
             std::operator&(&pVVar19->_fVars,(bitset<100UL> *)&prodAgg);
        bVar42 = std::operator&((bitset<100UL> *)&overlapFunc,&pVVar16->_fVars);
        this_01 = &(this->dependentComputation).
                   super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>.
                   _M_impl.super__Vector_impl_data._M_start[sVar35].view;
        if (bVar42.super__Base_bitset<2UL>._M_w[1] == 0 &&
            bVar42.super__Base_bitset<2UL>._M_w[0] == 0) {
          this_01 = &viewReg;
        }
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back(this_01,(value_type *)
                            ((long)&((aggregate->_incoming).
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar29));
        sVar18 = QueryCompiler::numberOfViews
                           ((this->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        *(size_t *)
         ((long)&((aggregate->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + lVar29) = sVar18;
      }
      lVar29 = lVar29 + 0x10;
    }
    bVar15 = std::_Base_bitset<24UL>::_M_is_any(&localFunctions.super__Base_bitset<24UL>);
    if ((bVar15) ||
       (viewReg.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        viewReg.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_001b2d48:
      uStack_318 = 0;
      uStack_317 = 0;
      local_328 = 0;
      uStack_320 = 0;
      uStack_31f = 0;
      local_348._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uStack_330 = 0;
      local_348._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_348._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      memcpy(&overlapFunc,&localFunctions,0xc0);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)&local_348,&viewReg);
      sVar18 = (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar32->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if ((this->viewLevelRegister[view_id] < depth) || (this->viewLevelRegister[view_id] == sVar18)
         ) {
        local_328 = 0;
        uStack_330 = sVar18;
      }
      else {
        ppVar7 = (localAggReg->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_328 = ppVar7[sVar35].second;
        uStack_330 = ppVar7[sVar35].first;
      }
      if (sVar40 == sVar18) {
        prodAgg.product.super__Base_bitset<24UL>._M_w._0_16_ =
             std::operator&(&dependentVariables,__y);
        bVar42 = std::operator&((bitset<100UL> *)&prodAgg,&nonVarOrder);
        bVar15 = true;
        if (bVar42.super__Base_bitset<2UL>._M_w[1] != 0 ||
            bVar42.super__Base_bitset<2UL>._M_w[0] != 0) goto LAB_001b2e33;
      }
      else {
LAB_001b2e33:
        bVar15 = false;
      }
      uStack_317._7_1_ = bVar15;
      iVar21 = std::
               _Hashtable<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this->productToVariableMap).
                       super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[depth]._M_h,
                      (key_type *)&overlapFunc);
      if (iVar21.super__Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true>.
          _M_cur == (__node_type *)0x0) {
        pvVar8 = (this->productToVariableRegister).
                 super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar29 = *(long *)&pvVar8[depth].
                           super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>.
                           _M_impl.super__Vector_impl_data;
        pPVar9 = *(pointer *)
                  ((long)&pvVar8[depth].
                          super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>.
                          _M_impl.super__Vector_impl_data + 8);
        pmVar22 = std::__detail::
                  _Map_base<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)((this->productToVariableMap).
                                   super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + depth),
                               (key_type *)&overlapFunc);
        mVar30 = (long)pPVar9 - lVar29 >> 8;
        *pmVar22 = mVar30;
        localComputation.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar35].first = depth;
        localComputation.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar35].second = mVar30;
        std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::push_back
                  ((this->productToVariableRegister).
                   super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + depth,(key_type *)&overlapFunc);
        sVar18 = localComputation.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar35].first;
        uVar23 = localComputation.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar35].second;
      }
      else {
        uVar23 = *(unsigned_long *)
                  ((long)iVar21.
                         super__Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true>
                         ._M_cur + 0x108);
        localComputation.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar35].first = depth;
        localComputation.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar35].second = uVar23;
        sVar18 = depth;
      }
      ppVar7 = (localAggReg->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar7[sVar35].first = sVar18;
      ppVar7[sVar35].second = uVar23;
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&local_348);
    }
    else {
      if (sVar40 == (long)(pvVar32->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(pvVar32->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start >> 3) {
        overlapFunc.super__Base_bitset<24UL>._M_w._0_16_ = std::operator&(&dependentVariables,__y);
        bVar42 = std::operator&((bitset<100UL> *)&overlapFunc,&nonVarOrder);
        if (bVar42.super__Base_bitset<2UL>._M_w[1] == 0 &&
            bVar42.super__Base_bitset<2UL>._M_w[0] == 0) goto LAB_001b2d48;
      }
      if (this->viewLevelRegister[view_id] == depth) {
        ppVar7 = (localAggReg->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + sVar35;
        uVar13 = *(undefined4 *)((long)&ppVar7->first + 4);
        uVar23 = ppVar7->second;
        uVar14 = *(undefined4 *)((long)&ppVar7->second + 4);
        ppVar1 = localComputation.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + sVar35;
        *(int *)&ppVar1->first = (int)ppVar7->first;
        *(undefined4 *)((long)&ppVar1->first + 4) = uVar13;
        *(int *)&ppVar1->second = (int)uVar23;
        *(undefined4 *)((long)&ppVar1->second + 4) = uVar14;
      }
      else if (sVar40 == (long)(pvVar32->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar32->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3) {
        std::operator<<((ostream *)&std::cerr,
                        "WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
        goto LAB_001b3019;
      }
    }
    sVar35 = sVar35 + 1;
    local_5f0 = local_5f0 + lVar41 * 0x10;
  } while( true );
}

Assistant:

void CppGenerator::registerAggregatesToVariables(
    Aggregate* aggregate, const size_t group_id,
    const size_t view_id, const size_t agg_id, const size_t depth,
    std::vector<std::pair<size_t, size_t>>& localAggReg)
{
    std::vector<std::pair<size_t,size_t>>& incoming = aggregate->_incoming;

    View* view = _qc->getView(view_id);
    TDNode* node = _td->getRelation(view->_origin);
    const var_bitset& relationBag = node->_bag;
    
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    
    const size_t numLocalProducts = aggregate->_agg.size();
    const size_t numberIncomingViews =
        (view->_origin == view->_destination ? node->_numOfNeighbors :
         node->_numOfNeighbors - 1);
    
    dyn_bitset loopFactors(_qc->numberOfViews()+1);

    std::vector<std::pair<size_t, size_t>>
        localComputation(numLocalProducts, {varOrder.size(), 0});

    std::vector<std::pair<size_t,size_t>> viewReg;
    prod_bitset localFunctions, considered;

    // TODO: we computed this before - perhaps reuse?! 
    // Compute dependent variables on the variables in the head of view:
    var_bitset dependentVariables;
    var_bitset nonVarOrder = view->_fVars & ~varOrderBitset;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (nonVarOrder[var])
        {
            // find bag that contains this variable
            if (relationBag[var])
                dependentVariables |= relationBag & ~varOrderBitset;
            else
            {
                // check incoming views
                for (const size_t& incViewID : incomingViews[view_id])
                {
                    View* incView = _qc->getView(incViewID);
                    if (incView->_fVars[var])
                        dependentVariables |= incView->_fVars & ~varOrderBitset;
                }
            }
        }
    }
    
    // go over each product and check if parts of it can be computed at current depth
    size_t incCounter = 0;
    for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
    {
        prod_bitset &product = aggregate->_agg[prodID];

        considered.reset();
        localFunctions.reset();
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (product.test(f) && !considered[f])
            {
                Function* function = _qc->getFunction(f);
                considered.set(f);
                
                // check if this function is covered
                if ((function->_fVars & coveredVariables[depth]) == function->_fVars)
                {   
                    // get all variables that this function depends on. 
                    var_bitset dependentFunctionVars;
                    for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                    {
                        if (function->_fVars[var])
                            dependentFunctionVars |= variableDependency[var];
                    }
                    dependentFunctionVars &= ~varOrderBitset;

                    // Find all functions that overlap / depend on this function
                    bool overlaps, computeHere;
                    var_bitset overlapVars;
                    prod_bitset overlapFunc = prod_bitset().set(f);

                    do
                    {
                        overlaps = false;
                        computeHere = true;
                        overlapVars |= function->_fVars;

                        for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                        {
                            if (product[f2] && !considered[f2] && !overlapFunc[f2])
                            {
                                Function* otherFunction = _qc->getFunction(f);
                                const var_bitset& otherFVars = otherFunction->_fVars;
                                // check if functions depend on each other
                                // if ((otherFunction->_fVars & nonVarOrder).any()) 
                                if ((otherFVars & dependentFunctionVars).any())
                                {
                                    considered.set(f2);
                                    overlapFunc.set(f2);
                                    overlaps = true;
                                    overlapVars |= otherFunction->_fVars;
                                    // check if otherFunction is covered
                                    if ((otherFVars & coveredVariables[depth]) !=
                                        otherFVars)
                                    {
                                        // if it is not covered then compute entire
                                        // group at later stage
                                        computeHere = false;
                                    }
                                }
                            }
                        }
                    } while(overlaps && !computeHere);
                                    
                    if (computeHere)
                    {
                        // check if the variables are dependent on vars in head
                        // of outcoming view
                        if (((overlapVars & ~varOrderBitset) & dependentVariables).any())
                        {
                            if (viewLevelRegister[view_id] != depth)
                                ERROR("ERROR ERROR: in dependent computation:"
                                      <<" viewLevelRegister[viewID] != depth\n");
                            
                            dependentComputation[prodID].product |= overlapFunc;
                        }
                        else // add all functions that overlap together at this level!
                            localFunctions |= overlapFunc;

                        // remove overlapping functions from product
                        product &= ~overlapFunc;
                    }
                }
            }
        }
        
        // go over each incoming views and check if their incoming products can
        // be computed at this level. 
        viewReg.clear();

        for (size_t n = 0; n < numberIncomingViews; ++n)
        {
            size_t& incViewID = incoming[incCounter].first;

            if (addableViews[incViewID + (depth * (_qc->numberOfViews()+1))])
            {
                View* incView = _qc->getView(incViewID);

                // TODO: I think the below statement is fine but should we use
                // dependent variables instead?! - here we just check if any of
                // the vars from incView are present in the vars for view
                if (((incView->_fVars & ~varOrderBitset) & view->_fVars).none())
                {
                    viewReg.push_back(incoming[incCounter]);

                    /************** PRINT OUT ****************/
                    // if (group_id == 5 &&  incoming[incCounter].first == 2 &&
                    //     incoming[incCounter].second == 125)
                    // {
                    //     std::cout << "##--------" <<
                    //         incoming[incCounter].first << " - " <<
                    //         incoming[incCounter].second << std::endl;
                    // }
                    /************** PRINT OUT ****************/
                }
                else
                {
                    // if (depth == viewLevelRegister[view_id])
                    // {
                    // std::cout << "This view has an additional variable: "+
                    //     viewName[incViewID]+"\nviewAgg: aggs_"+viewName[incViewID]
                    //     +"-"+" viewLevelReg: "<<viewLevelRegister[view_id]<<
                    //     " depth: " << depth << std::endl;
                    dependentComputation[prodID].view.push_back(
                        incoming[incCounter]);
                    // }
                    // if (depth != viewLevelRegister[view_id])
                    // {
                    //     ERROR(depth << "  " << incViewID << "  " << view_id << " "
                    //           << viewLevelRegister[view_id] << " "+node->_name+" ");
                    //     ERROR(view->_fVars << std::endl);
                    //     ERROR("IS THIS A MISTAKE?!\n");
                    // }       
                }

                // This incoming view will no longer be considered 
                incoming[incCounter].first = _qc->numberOfViews();
            }
            ++incCounter;
        }
        
        // Check if this product has already been computed, if not we add it
        // to the list
        if (localFunctions.any() || !viewReg.empty() ||
            (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none()))
        {                
            ProductAggregate prodAgg;
            prodAgg.product = localFunctions;
            prodAgg.viewAggregate = viewReg;
            
            if (depth <= viewLevelRegister[view_id] &&
                viewLevelRegister[view_id] != varOrder.size())
            {
                prodAgg.previous = localAggReg[prodID];
            }
            else
                prodAgg.previous = {varOrder.size(), 0};

            if (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none())
                prodAgg.multiplyByCount = true;
            else
                prodAgg.multiplyByCount = false;
            
            auto prod_it = productToVariableMap[depth].find(prodAgg);
            if (prod_it != productToVariableMap[depth].end())
            {
                // Then update the localAggReg for this product
                localComputation[prodID] = {depth,prod_it->second};                
            }
            else
            {
                size_t newProdID =  productToVariableRegister[depth].size();
                // If so, add it to the aggregate register
                productToVariableMap[depth][prodAgg] = newProdID;
                localComputation[prodID] = {depth,newProdID};
                productToVariableRegister[depth].push_back(prodAgg);                
            }
            
            localAggReg[prodID] = localComputation[prodID];

            /******** PRINT OUT **********/
            // dyn_bitset contribViews(_qc->numberOfViews()+1);
            // for (auto& p : viewReg)
            //     contribViews.set(p.first);
            
            // std::cout << "group_id " << group_id << " depth: " << depth << std::endl;
            // std::cout << genProductString(*node, contribViews, localFunctions)
            //           << std::endl;
            /******** PRINT OUT **********/
        }    
        // if we didn't set a new computation - check if this level is the view Level:
        else if (depth == viewLevelRegister[view_id])
        {
            // Add the previous aggregate to local computation
            localComputation[prodID] = localAggReg[prodID];
            // TODO: (CONSIDER) think about keeping this separate as above
        }
        else if (depth+1 == varOrder.size())
        {
            ERROR("WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
            exit(1);
        }
    }
    
    // recurse to next depth ! 
    if (depth != varOrder.size()-1)
    {
        registerAggregatesToVariables(
            aggregate,group_id,view_id,agg_id,depth+1,localAggReg);
    }
    else
    {
        // resetting aggRegisters !        
        for (size_t i = 0; i < numLocalProducts; ++i)
            localAggReg[i] = {varOrder.size(),0};
    }
    
    if (depth > viewLevelRegister[view_id] ||
        viewLevelRegister[view_id] == varOrder.size())
    {
        // now adding aggregates coming from below to running sum
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            if (localComputation[prodID].first < varOrder.size() ||
                localAggReg[prodID].first < varOrder.size())
            {
                PostAggRegTuple postTuple;                
                postTuple.local = localComputation[prodID];
                postTuple.post = localAggReg[prodID];

                auto postit = postRegisterMap[depth].find(postTuple);
                if (postit != postRegisterMap[depth].end())
                {
                    localAggReg[prodID] = {depth,postit->second};
                }
                else
                {
                    size_t postProdID = postRegisterList[depth].size();
                    postRegisterMap[depth][postTuple] = postProdID;
                    localAggReg[prodID] = {depth, postProdID};
                    postRegisterList[depth].push_back(postTuple);
                }
            }
            else if (depth+1 != varOrder.size())
            {
                ERROR("ERROR ERROR ERROR - postAggregate is empty ");
                ERROR("we would expect it to contain something || ");
                ERROR(depth << " : " << varOrder.size()<< "  " << prodID << "\n");
                exit(1);
            }
        }
    }
    
    if (depth == viewLevelRegister[view_id] || 
        (depth == 0 && viewLevelRegister[view_id] == varOrder.size()))
    {
        // We now add both components to the respecitve registers
        // std::pair<bool,size_t> regTupleProduct;
        // std::pair<bool,size_t> regTupleView;

        // now adding aggregates to final computation 
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            // TODO: Why not avoid this loop and put the vectors into the
            // AggregateTuple
            // This is then one aggregateTuple for one specific Aggregate for
            // this view
            // THen add this aggregate to the specific view and not to depth
            
            const prod_bitset&  dependentFunctions =
                dependentComputation[prodID].product;
            const std::vector<std::pair<size_t,size_t>>& dependentViewReg =
                dependentComputation[prodID].view;

            ProductAggregate prodAgg;
            prodAgg.product = dependentFunctions;
            prodAgg.viewAggregate = dependentViewReg;
            prodAgg.previous = {varOrder.size(), 0};
            
            AggregateTuple aggComputation;
            aggComputation.viewID = view_id;
            aggComputation.aggID = agg_id;
            if (viewLevelRegister[view_id] != varOrder.size()) 
                aggComputation.local = localComputation[prodID];
            else
                 aggComputation.local = {varOrder.size(), 0};
            aggComputation.post = localAggReg[prodID];
            aggComputation.dependentComputation = dependentComputation[prodID];
            aggComputation.dependentProdAgg = prodAgg;

            if (dependentFunctions.any() || !dependentViewReg.empty())
                aggComputation.hasDependentComputation = true;
            
            // if (dependentFunctions.any() || !dependentViewReg.empty())
            // {                
            //     ProductAggregate prodAgg;
            //     prodAgg.product = dependentFunctions;
            //     prodAgg.viewAggregate = dependentViewReg;
            //     prodAgg.previous = {varOrder.size(), 0};
            //     auto prod_it = productToVariableMap[depDepth].find(prodAgg);
            //     if (prod_it != productToVariableMap[depDepth].end())
            //     {
            //         // Then update the localAggReg for this product
            //         aggComputation.dependentProduct = {depDepth,prod_it->second};
            //     }
            //     else
            //     {
            //         // If so, add it to the aggregate register
            //         size_t newProdID = productToVariableRegister[depDepth].size();
            //         productToVariableMap[depDepth][prodAgg] = newProdID;
            //         aggComputation.dependentProduct = {depDepth,newProdID};
            //         productToVariableRegister[depDepth].push_back(prodAgg);
            //     }
            // }
            // else
            // {
            //     aggComputation.dependentProduct = {varOrder.size(), 0};
            // }
            
            aggregateComputation[view_id].push_back(aggComputation);
        }
    }
}